

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread-posix.c
# Opt level: O0

PUThread *
p_uthread_create_internal
          (PUThreadFunc func,pboolean joinable,PUThreadPriority prio,psize stack_size)

{
  int iVar1;
  pboolean pVar2;
  PUThread *pPVar3;
  bool bVar4;
  plong min_stack;
  pint sched_policy;
  pint native_prio;
  sched_param sched;
  pint create_code;
  pthread_attr_t attr;
  PUThread *ret;
  psize stack_size_local;
  PUThreadPriority prio_local;
  pboolean joinable_local;
  PUThreadFunc func_local;
  
  func_local = (PUThreadFunc)p_malloc0(0x38);
  if (func_local == (PUThreadFunc)0x0) {
    printf("** Error: %s **\n","PUThread::p_uthread_create_internal: failed to allocate memory");
    func_local = (PUThreadFunc)0x0;
  }
  else {
    *(pboolean *)(func_local + 0xc) = joinable;
    iVar1 = pthread_attr_init((pthread_attr_t *)&sched);
    if (iVar1 == 0) {
      iVar1 = pthread_attr_setdetachstate((pthread_attr_t *)&sched,(uint)(joinable == 0));
      if (iVar1 == 0) {
        if (prio == P_UTHREAD_PRIORITY_INHERIT) {
          iVar1 = pthread_attr_setinheritsched((pthread_attr_t *)&sched,0);
          if (iVar1 != 0) {
            printf("** Warning: %s **\n",
                   "PUThread::p_uthread_create_internal: pthread_attr_setinheritsched() failed");
          }
        }
        else {
          iVar1 = pthread_attr_getschedpolicy((pthread_attr_t *)&sched,(int *)&min_stack);
          if (iVar1 == 0) {
            pVar2 = pp_uthread_get_unix_priority
                              (prio,(int *)&min_stack,(int *)((long)&min_stack + 4));
            if (pVar2 == 1) {
              memset(&sched_policy,0,4);
              sched_policy = min_stack._4_4_;
              iVar1 = pthread_attr_setinheritsched((pthread_attr_t *)&sched,1);
              bVar4 = true;
              if (iVar1 == 0) {
                iVar1 = pthread_attr_setschedpolicy((pthread_attr_t *)&sched,(int)min_stack);
                bVar4 = true;
                if (iVar1 == 0) {
                  iVar1 = pthread_attr_setschedparam
                                    ((pthread_attr_t *)&sched,(sched_param *)&sched_policy);
                  bVar4 = iVar1 != 0;
                }
              }
              if (bVar4) {
                printf("** Warning: %s **\n",
                       "PUThread::p_uthread_create_internal: failed to set priority");
              }
            }
            else {
              printf("** Warning: %s **\n",
                     "PUThread::p_uthread_create_internal: pp_uthread_get_unix_priority() failed");
            }
          }
          else {
            printf("** Warning: %s **\n",
                   "PUThread::p_uthread_create_internal: pthread_attr_getschedpolicy() failed");
          }
        }
        if (stack_size != 0) {
          pPVar3 = (PUThread *)sysconf(0x4b);
          if ((long)pPVar3 < 1) {
            printf("** Warning: %s **\n",
                   "PUThread::p_uthread_create_internal: sysconf() with _SC_THREAD_STACK_MIN failed"
                  );
            ret = (PUThread *)stack_size;
          }
          else {
            ret = (PUThread *)stack_size;
            if (stack_size < pPVar3) {
              ret = pPVar3;
            }
          }
          iVar1 = pthread_attr_setstacksize((pthread_attr_t *)&sched,(size_t)ret);
          if (iVar1 != 0) {
            printf("** Warning: %s **\n",
                   "PUThread::p_uthread_create_internal: pthread_attr_setstacksize() failed");
          }
        }
        native_prio = pthread_create((pthread_t *)(func_local + 0x30),(pthread_attr_t *)&sched,
                                     (__start_routine *)func,func_local);
        if (native_prio == 1) {
          pthread_attr_setinheritsched((pthread_attr_t *)&sched,0);
          native_prio = pthread_create((pthread_t *)(func_local + 0x30),(pthread_attr_t *)&sched,
                                       (__start_routine *)func,func_local);
        }
        if (native_prio == 0) {
          *(PUThreadPriority *)(func_local + 0x20) = prio;
          pthread_attr_destroy((pthread_attr_t *)&sched);
        }
        else {
          printf("** Error: %s **\n","PUThread::p_uthread_create_internal: pthread_create() failed")
          ;
          pthread_attr_destroy((pthread_attr_t *)&sched);
          p_free(func_local);
          func_local = (PUThreadFunc)0x0;
        }
      }
      else {
        printf("** Error: %s **\n",
               "PUThread::p_uthread_create_internal: pthread_attr_setdetachstate() failed");
        pthread_attr_destroy((pthread_attr_t *)&sched);
        p_free(func_local);
        func_local = (PUThreadFunc)0x0;
      }
    }
    else {
      printf("** Error: %s **\n","PUThread::p_uthread_create_internal: pthread_attr_init() failed");
      p_free(func_local);
      func_local = (PUThreadFunc)0x0;
    }
  }
  return (PUThread *)func_local;
}

Assistant:

PUThread *
p_uthread_create_internal (PUThreadFunc		func,
			   pboolean		joinable,
			   PUThreadPriority	prio,
			   psize		stack_size)
{
	PUThread		*ret;
	pthread_attr_t		attr;
	pint			create_code;
#ifdef PLIBSYS_HAS_POSIX_SCHEDULING
	struct sched_param	sched;
	pint			native_prio;
	pint			sched_policy;
#endif

#if defined (PLIBSYS_HAS_POSIX_STACKSIZE) && defined (_SC_THREAD_STACK_MIN)
	plong			min_stack;
#endif

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PUThread))) == NULL)) {
		P_ERROR ("PUThread::p_uthread_create_internal: failed to allocate memory");
		return NULL;
	}

	ret->base.joinable = joinable;

	if (P_UNLIKELY (pthread_attr_init (&attr) != 0)) {
		P_ERROR ("PUThread::p_uthread_create_internal: pthread_attr_init() failed");
		p_free (ret);
		return NULL;
	}

	if (P_UNLIKELY (pthread_attr_setdetachstate (&attr,
						     joinable ? PTHREAD_CREATE_JOINABLE
							      : PTHREAD_CREATE_DETACHED) != 0)) {
		P_ERROR ("PUThread::p_uthread_create_internal: pthread_attr_setdetachstate() failed");
		pthread_attr_destroy (&attr);
		p_free (ret);
		return NULL;
	}

#ifdef PLIBSYS_HAS_POSIX_SCHEDULING
	if (prio == P_UTHREAD_PRIORITY_INHERIT) {
		if (P_UNLIKELY (pthread_attr_setinheritsched (&attr, PTHREAD_INHERIT_SCHED) != 0))
			P_WARNING ("PUThread::p_uthread_create_internal: pthread_attr_setinheritsched() failed");
	} else {
		if (P_LIKELY (pthread_attr_getschedpolicy (&attr, &sched_policy) == 0)) {
			if (P_LIKELY (pp_uthread_get_unix_priority (prio,
								     &sched_policy,
								     &native_prio) == TRUE)) {
				memset (&sched, 0, sizeof (sched));
				sched.sched_priority = native_prio;

				if (P_LIKELY (pthread_attr_setinheritsched (&attr, PTHREAD_EXPLICIT_SCHED) != 0 ||
					      pthread_attr_setschedpolicy (&attr, sched_policy) != 0 ||
					      pthread_attr_setschedparam (&attr, &sched) != 0))
					P_WARNING ("PUThread::p_uthread_create_internal: failed to set priority");
			} else
				P_WARNING ("PUThread::p_uthread_create_internal: pp_uthread_get_unix_priority() failed");
		} else
			P_WARNING ("PUThread::p_uthread_create_internal: pthread_attr_getschedpolicy() failed");
	}
#endif

#ifdef PLIBSYS_HAS_POSIX_STACKSIZE
#  ifdef _SC_THREAD_STACK_MIN
	if (stack_size > 0) {
		min_stack = (plong) sysconf (_SC_THREAD_STACK_MIN);

		if (P_LIKELY (min_stack > 0)) {
			if (P_UNLIKELY (stack_size < (psize) min_stack))
				stack_size = (psize) min_stack;
		} else
			P_WARNING ("PUThread::p_uthread_create_internal: sysconf() with _SC_THREAD_STACK_MIN failed");

		if (P_UNLIKELY (pthread_attr_setstacksize (&attr, stack_size) != 0))
			P_WARNING ("PUThread::p_uthread_create_internal: pthread_attr_setstacksize() failed");
	}
#  endif
#endif

	create_code = pthread_create (&ret->hdl, &attr, func, ret);

#ifdef EPERM
	if (create_code == EPERM) {
#  ifdef PLIBSYS_HAS_POSIX_SCHEDULING
		pthread_attr_setinheritsched (&attr, PTHREAD_INHERIT_SCHED);
#  endif
		create_code = pthread_create (&ret->hdl, &attr, func, ret);
	}
#endif

	if (P_UNLIKELY (create_code != 0)) {
		P_ERROR ("PUThread::p_uthread_create_internal: pthread_create() failed");
		pthread_attr_destroy (&attr);
		p_free (ret);
		return NULL;
	}

	ret->base.prio = prio;
	pthread_attr_destroy (&attr);

	return ret;
}